

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O3

void __thiscall SAT::aEnqueue(SAT *this,Lit p,Reason r,int l)

{
  uint uVar1;
  ostream *poVar2;
  Lit local_74;
  string local_70;
  string local_50;
  
  local_74.x = p.x;
  if (so.debug) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"a-enqueue literal ",0x12);
    getLitString_abi_cxx11_(&local_50,p.x);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," because ",9);
    showReason_abi_cxx11_(&local_70,r);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," and l=",7);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,l);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  uVar1 = p.x >> 1;
  (this->assigns).data[uVar1] = -((byte)p.x & 1) | 1;
  (this->trailpos).data[uVar1] = engine.trail_lim.data[(uint)l] + -1;
  (this->reason).data[uVar1].field_0 = r.field_0;
  vec<Lit>::push((this->trail).data + (uint)l,&local_74);
  return;
}

Assistant:

void SAT::aEnqueue(Lit p, Reason r, int l) {
	if (so.debug) {
		std::cerr << "a-enqueue literal " << getLitString(toInt(p)) << " because " << showReason(r)
							<< " and l=" << l << "\n";
	}
	assert(value(p) == l_Undef);
	const int v = var(p);
	assigns[v] = toInt(lbool(!sign(p)));
	trailpos[v] = engine.trail_lim[l] - 1;
	reason[v] = r;
	trail[l].push(p);
}